

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_get_compression_type(fitsfile *fptr,int *ctype,int *status)

{
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  
  *in_RSI = *(int *)(*(long *)(in_RDI + 8) + 1000);
  if (((((*in_RSI != 0xb) && (*in_RSI != 0x15)) && (*in_RSI != 0x16)) &&
      ((*in_RSI != 0x1f && (*in_RSI != 0x29)))) &&
     ((*in_RSI != 0x33 && ((*in_RSI != -1 && (*in_RSI != 0)))))) {
    ffpmsg((char *)0x1df1e4);
    *in_RDX = 0x19d;
  }
  return *in_RDX;
}

Assistant:

int fits_get_compression_type(fitsfile *fptr,  /* I - FITS file pointer     */
       int *ctype,   /* image compression type code;                        */
                     /* allowed values:                                     */
		     /* RICE_1, GZIP_1, GZIP_2, PLIO_1, HCOMPRESS_1, BZIP2_1 */
       int *status)  /* IO - error status                                   */
{
/*
   This routine returns the image compression algorithm that should be
   used when writing a FITS image.  The image is divided into tiles, and
   each tile is compressed and stored in a row of at variable length binary
   table column.
*/
    *ctype = (fptr->Fptr)->request_compress_type;

    if (*ctype != RICE_1 && 
        *ctype != GZIP_1 && 
        *ctype != GZIP_2 && 
        *ctype != PLIO_1 && 
        *ctype != HCOMPRESS_1 && 
        *ctype != BZIP2_1 && 
        *ctype != NOCOMPRESS &&
	*ctype != 0   ) 

    {
	ffpmsg("unknown compression algorithm (fits_get_compression_type)");
	*status = DATA_COMPRESSION_ERR; 
    }
 
    return(*status);
}